

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

int cm_archive_read_open_file(archive *a,char *file,int block_size)

{
  wchar_t wVar1;
  wchar_t *wfilename;
  Encoding local_40 [8];
  wstring wfile;
  int block_size_local;
  char *file_local;
  archive *a_local;
  
  cmsys::Encoding::ToWide_abi_cxx11_(local_40,file);
  wfilename = (wchar_t *)std::__cxx11::wstring::c_str();
  wVar1 = archive_read_open_filename_w(a,wfilename,(long)block_size);
  std::__cxx11::wstring::~wstring((wstring *)local_40);
  return wVar1;
}

Assistant:

static int cm_archive_read_open_file(struct archive* a, const char* file,
                                     int block_size)
{
#if cmsys_STL_HAS_WSTRING
  std::wstring wfile = cmsys::Encoding::ToWide(file);
  return archive_read_open_filename_w(a, wfile.c_str(), block_size);
#else
  return archive_read_open_filename(a, file, block_size);
#endif
}